

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O2

int getBiomeAt(Generator *g,int scale,int x,int y,int z)

{
  Range r_00;
  Range r_01;
  int iVar1;
  int *cache;
  Range r;
  
  r_00.x = x;
  r_00.scale = scale;
  r_00.sy = 1;
  r_00.y = y;
  r_00.z = z;
  r_00.sx = 1;
  r_00.sz = 1;
  cache = allocCache(g,r_00);
  r_01.x = x;
  r_01.scale = scale;
  r_01.sy = 1;
  r_01.y = y;
  r_01.z = z;
  r_01.sx = 1;
  r_01.sz = 1;
  iVar1 = genBiomes(g,cache,r_01);
  if (iVar1 == 0) {
    iVar1 = *cache;
  }
  else {
    iVar1 = -1;
  }
  free(cache);
  return iVar1;
}

Assistant:

int getBiomeAt(const Generator *g, int scale, int x, int y, int z)
{
    Range r = {scale, x, z, 1, 1, y, 1};
    int *ids = allocCache(g, r);
    int id = genBiomes(g, ids, r);
    if (id == 0)
        id = ids[0];
    else
        id = none;
    free(ids);
    return id;
}